

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_4,_2> *
deqp::gles3::Functional::MatrixCaseUtils::matrixCompMult<float,4,2>
          (Matrix<float,_4,_2> *a,Matrix<float,_4,_2> *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector<float,_4> *pVVar7;
  Matrix<float,_4,_2> *retVal;
  Matrix<float,_4,_2> *in_RDI;
  
  (in_RDI->m_data).m_data[0].m_data[0] = 1.0;
  (in_RDI->m_data).m_data[0].m_data[1] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[2] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[3] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[1].m_data[1] = 1.0;
  pVVar7 = (in_RDI->m_data).m_data;
  pVVar7[1].m_data[2] = 0.0;
  pVVar7[1].m_data[3] = 0.0;
  fVar1 = (a->m_data).m_data[0].m_data[1];
  fVar2 = (a->m_data).m_data[0].m_data[2];
  fVar3 = (a->m_data).m_data[0].m_data[3];
  fVar4 = (b->m_data).m_data[0].m_data[1];
  fVar5 = (b->m_data).m_data[0].m_data[2];
  fVar6 = (b->m_data).m_data[0].m_data[3];
  (in_RDI->m_data).m_data[0].m_data[0] =
       (b->m_data).m_data[0].m_data[0] * (a->m_data).m_data[0].m_data[0];
  (in_RDI->m_data).m_data[0].m_data[1] = fVar4 * fVar1;
  (in_RDI->m_data).m_data[0].m_data[2] = fVar5 * fVar2;
  (in_RDI->m_data).m_data[0].m_data[3] = fVar6 * fVar3;
  fVar1 = (a->m_data).m_data[1].m_data[1];
  fVar2 = (a->m_data).m_data[1].m_data[2];
  fVar3 = (a->m_data).m_data[1].m_data[3];
  fVar4 = (b->m_data).m_data[1].m_data[1];
  fVar5 = (b->m_data).m_data[1].m_data[2];
  fVar6 = (b->m_data).m_data[1].m_data[3];
  (in_RDI->m_data).m_data[1].m_data[0] =
       (b->m_data).m_data[1].m_data[0] * (a->m_data).m_data[1].m_data[0];
  (in_RDI->m_data).m_data[1].m_data[1] = fVar4 * fVar1;
  (in_RDI->m_data).m_data[1].m_data[2] = fVar5 * fVar2;
  (in_RDI->m_data).m_data[1].m_data[3] = fVar6 * fVar3;
  return in_RDI;
}

Assistant:

tcu::Matrix<T, Rows, Cols> matrixCompMult (const tcu::Matrix<T, Rows, Cols>& a, const tcu::Matrix<T, Rows, Cols>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a(r,c) * b(r, c);

	return retVal;
}